

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (MapFieldGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor FVar2;
  FieldDescriptor FVar3;
  Descriptor *pDVar4;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  Formatter format;
  Formatter local_90;
  string local_58;
  FieldDescriptor *local_38;
  
  local_90.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_90.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()<>(&local_90,"if (!this->_internal_$name$().empty()) {\n");
  io::Printer::Indent(local_90.printer_);
  pDVar4 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"key","");
  field = Descriptor::FindFieldByName(pDVar4,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pDVar4 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
  field_00 = Descriptor::FindFieldByName(pDVar4,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_58._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_58,&local_38)
    ;
  }
  FVar2 = field[2];
  if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
    local_58._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_38 = field_00;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_58,
               &local_38);
  }
  FVar3 = field_00[2];
  Formatter::operator()<>
            (&local_90,
             "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n");
  if (FVar2 == (FieldDescriptor)0x9) {
    Formatter::operator()<>
              (&local_90,
               "typedef ConstPtr SortItem;\ntypedef ::$proto_ns$::internal::CompareByDerefFirst<SortItem> Less;\n"
              );
  }
  else {
    Formatter::operator()<>
              (&local_90,
               "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::$proto_ns$::internal::CompareByFirstField<SortItem> Less;\n"
              );
    if (FVar3 != (FieldDescriptor)0x9) goto LAB_002e24a5;
  }
  Formatter::operator()<>
            (&local_90,"struct Utf8Check {\n  static void Check(ConstPtr p) {\n    (void)p;\n");
  io::Printer::Indent(local_90.printer_);
  io::Printer::Indent(local_90.printer_);
  if (FVar2 == (FieldDescriptor)0x9) {
    GenerateUtf8CheckCodeForString
              (field,(this->super_FieldGenerator).options_,false,
               "p->first.data(), static_cast<int>(p->first.length()),\n",&local_90);
  }
  if (FVar3 == (FieldDescriptor)0x9) {
    GenerateUtf8CheckCodeForString
              (field_00,(this->super_FieldGenerator).options_,false,
               "p->second.data(), static_cast<int>(p->second.length()),\n",&local_90);
  }
  io::Printer::Outdent(local_90.printer_);
  io::Printer::Outdent(local_90.printer_);
  Formatter::operator()<>(&local_90,"  }\n};\n");
LAB_002e24a5:
  Formatter::operator()<>
            (&local_90,
             "\nif (stream->IsSerializationDeterministic() &&\n    this->_internal_$name$().size() > 1) {\n  ::std::unique_ptr<SortItem[]> items(\n      new SortItem[this->_internal_$name$().size()]);\n  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->_internal_$name$().begin();\n      it != this->_internal_$name$().end(); ++it, ++n) {\n    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n"
            );
  io::Printer::Indent(local_90.printer_);
  GenerateSerializationLoop
            (&local_90,FVar2 == (FieldDescriptor)0x9,FVar3 == (FieldDescriptor)0x9,true);
  io::Printer::Outdent(local_90.printer_);
  Formatter::operator()<>(&local_90,"} else {\n");
  io::Printer::Indent(local_90.printer_);
  GenerateSerializationLoop
            (&local_90,FVar2 == (FieldDescriptor)0x9,FVar3 == (FieldDescriptor)0x9,false);
  io::Printer::Outdent(local_90.printer_);
  Formatter::operator()<>(&local_90,"}\n");
  io::Printer::Outdent(local_90.printer_);
  Formatter::operator()<>(&local_90,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90.vars_._M_t);
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("if (!this->_internal_$name$().empty()) {\n");
  format.Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  format(
      "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    format(
        "typedef ConstPtr SortItem;\n"
        "typedef ::$proto_ns$::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    format(
        "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::$proto_ns$::internal::CompareByFirstField<SortItem> "
        "Less;\n");
  }
  bool utf8_check = string_key || string_value;
  if (utf8_check) {
    format(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n"
        // p may be unused when GetUtf8CheckMode evaluates to kNone,
        // thus disabling the validation.
        "    (void)p;\n");
    format.Indent();
    format.Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(
          key_field, options_, false,
          "p->first.data(), static_cast<int>(p->first.length()),\n", format);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(
          value_field, options_, false,
          "p->second.data(), static_cast<int>(p->second.length()),\n", format);
    }
    format.Outdent();
    format.Outdent();
    format(
        "  }\n"
        "};\n");
  }

  format(
      "\n"
      "if (stream->IsSerializationDeterministic() &&\n"
      "    this->_internal_$name$().size() > 1) {\n"
      "  ::std::unique_ptr<SortItem[]> items(\n"
      "      new SortItem[this->_internal_$name$().size()]);\n"
      "  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type "
      "size_type;\n"
      "  size_type n = 0;\n"
      "  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->_internal_$name$().begin();\n"
      "      it != this->_internal_$name$().end(); ++it, ++n) {\n"
      "    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, true);
  format.Outdent();
  format("} else {\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, false);
  format.Outdent();
  format("}\n");
  format.Outdent();
  format("}\n");
}